

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O1

char * convertLatin1toUTF8(char *source)

{
  char *pcVar1;
  size_t sVar2;
  char cVar3;
  char *pcVar4;
  size_t __nmemb;
  char *s;
  
  cVar3 = *source;
  if (cVar3 == '\0') {
    __nmemb = 1;
  }
  else {
    pcVar1 = source + 1;
    __nmemb = 1;
    do {
      __nmemb = (__nmemb - (-1 < cVar3)) + 2;
      cVar3 = *pcVar1;
      pcVar1 = pcVar1 + 1;
    } while (cVar3 != '\0');
  }
  pcVar1 = (char *)calloc(__nmemb,1);
  cVar3 = *source;
  if (cVar3 != '\0') {
    pcVar4 = source + 1;
    s = pcVar1;
    do {
      sVar2 = _glfwEncodeUTF8(s,(int)cVar3);
      s = s + sVar2;
      cVar3 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar3 != '\0');
  }
  return pcVar1;
}

Assistant:

static char* convertLatin1toUTF8(const char* source)
{
    size_t size = 1;
    const char* sp;

    for (sp = source;  *sp;  sp++)
        size += (*sp & 0x80) ? 2 : 1;

    char* target = calloc(size, 1);
    char* tp = target;

    for (sp = source;  *sp;  sp++)
        tp += _glfwEncodeUTF8(tp, *sp);

    return target;
}